

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::WriteTable(WatWriter *this,Table *table)

{
  NextChar in_R8D;
  string_view str;
  
  WriteOpenSpace(this,"table");
  str._M_str = (table->name)._M_dataplus._M_p;
  str._M_len = (table->name)._M_string_length;
  WriteNameOrIndex(this,str,this->table_index_,in_R8D);
  WriteInlineExports(this,Table,this->table_index_);
  WriteInlineImport(this,Table,this->table_index_);
  WriteLimits(this,&table->elem_limits);
  WriteType(this,table->elem_type,None);
  WriteCloseNewline(this);
  this->table_index_ = this->table_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteTable(const Table& table) {
  WriteOpenSpace("table");
  WriteNameOrIndex(table.name, table_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Table, table_index_);
  WriteInlineImport(ExternalKind::Table, table_index_);
  WriteLimits(table.elem_limits);
  WriteType(table.elem_type, NextChar::None);
  WriteCloseNewline();
  table_index_++;
}